

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetStopTime(void *cvode_mem,realtype tstop)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetStopTime","cvode_mem = NULL illegal.");
  }
  else {
    if ((0 < *(long *)((long)cvode_mem + 0x358)) &&
       ((tstop - *(double *)((long)cvode_mem + 0x168)) * *(double *)((long)cvode_mem + 0x140) < 0.0)
       ) {
      cvProcessError((CVodeMem)cvode_mem,-0x16,"CVODE","CVodeSetStopTime",
                     "The value tstop = %lg is behind current t = %lg in the direction of integration."
                    );
      return -0x16;
    }
    *(realtype *)((long)cvode_mem + 0x118) = tstop;
    *(undefined4 *)((long)cvode_mem + 0x110) = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetStopTime(void *cvode_mem, realtype tstop)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetStopTime", MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* If CVode was called at least once, test if tstop is legal
   * (i.e. if it was not already passed).
   * If CVodeSetStopTime is called before the first call to CVode,
   * tstop will be checked in CVode. */
  if (cv_mem->cv_nst > 0) {

    if ( (tstop - cv_mem->cv_tn) * cv_mem->cv_h < ZERO ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetStopTime", MSGCV_BAD_TSTOP, tstop, cv_mem->cv_tn);
      return(CV_ILL_INPUT);
    }

  }

  cv_mem->cv_tstop = tstop;
  cv_mem->cv_tstopset = SUNTRUE;

  return(CV_SUCCESS);
}